

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O3

Ssw_Cla_t * Ssw_ClassesPrepareFromReprs(Aig_Man_t *pAig)

{
  int iVar1;
  void **ppvVar2;
  Aig_Obj_t *pAVar3;
  int *piVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t **ppAVar6;
  int iVar7;
  Ssw_Cla_t *pSVar8;
  Aig_Obj_t **ppAVar9;
  void *__s1;
  long lVar10;
  long lVar11;
  Vec_Ptr_t *pVVar12;
  int iVar13;
  size_t __nmemb;
  
  pSVar8 = Ssw_ClassesStart(pAig);
  pVVar12 = pAig->vObjs;
  __nmemb = (size_t)pVVar12->nSize;
  ppAVar9 = (Aig_Obj_t **)calloc(__nmemb,8);
  pSVar8->pMemClasses = ppAVar9;
  pSVar8->nCands1 = 0;
  if ((long)__nmemb < 1) {
    pSVar8->nClasses = 0;
    __s1 = calloc(__nmemb,4);
  }
  else {
    ppvVar2 = pVVar12->pArray;
    iVar7 = 0;
    lVar10 = 0;
    do {
      if (ppvVar2[lVar10] != (void *)0x0) {
        if (pAig->pReprs == (Aig_Obj_t **)0x0) {
          if (pAig->pConst1 == (Aig_Obj_t *)0x0) goto LAB_006118cb;
        }
        else {
          pAVar3 = pAig->pReprs[*(int *)((long)ppvVar2[lVar10] + 0x24)];
          if (pAVar3 == pAig->pConst1) {
LAB_006118cb:
            iVar7 = iVar7 + 1;
            pSVar8->nCands1 = iVar7;
          }
          else if (pAVar3 != (Aig_Obj_t *)0x0) {
            piVar4 = pSVar8->pClassSizes;
            iVar13 = piVar4[pAVar3->Id];
            piVar4[pAVar3->Id] = iVar13 + 1;
            if (iVar13 == 0) {
              piVar4[pAVar3->Id] = piVar4[pAVar3->Id] + 1;
            }
          }
        }
      }
      lVar10 = lVar10 + 1;
      iVar13 = pVVar12->nSize;
      __nmemb = (size_t)iVar13;
    } while (lVar10 < (long)__nmemb);
    pSVar8->nClasses = 0;
    __s1 = calloc(__nmemb,4);
    if (0 < iVar13) {
      iVar7 = 0;
      lVar10 = 0;
      iVar13 = 0;
      do {
        pAVar3 = (Aig_Obj_t *)pVVar12->pArray[lVar10];
        if (pAVar3 != (Aig_Obj_t *)0x0) {
          iVar1 = pSVar8->pClassSizes[lVar10];
          if (iVar1 == 0) {
            if ((pAig->pReprs != (Aig_Obj_t **)0x0) &&
               (pAVar5 = pAig->pReprs[pAVar3->Id],
               pAVar5 != (Aig_Obj_t *)0x0 && pAVar5 != pAig->pConst1)) {
              lVar11 = (long)pAVar5->Id;
              ppAVar6 = pSVar8->pId2Class[lVar11];
              iVar1 = *(int *)((long)__s1 + lVar11 * 4);
              *(int *)((long)__s1 + lVar11 * 4) = iVar1 + 1;
              ppAVar6[iVar1] = pAVar3;
            }
          }
          else {
            lVar11 = (long)iVar13;
            pSVar8->pId2Class[lVar10] = ppAVar9 + lVar11;
            iVar13 = iVar1 + iVar13;
            iVar1 = *(int *)((long)__s1 + lVar10 * 4);
            *(int *)((long)__s1 + lVar10 * 4) = iVar1 + 1;
            (ppAVar9 + lVar11)[iVar1] = pAVar3;
            iVar7 = iVar7 + 1;
            pSVar8->nClasses = iVar7;
          }
        }
        lVar10 = lVar10 + 1;
        pVVar12 = pAig->vObjs;
        __nmemb = (size_t)pVVar12->nSize;
      } while (lVar10 < (long)__nmemb);
      goto LAB_006119b5;
    }
  }
  iVar7 = 0;
  iVar13 = 0;
LAB_006119b5:
  pSVar8->pMemClassesFree = ppAVar9 + iVar13;
  pSVar8->nLits = iVar13 - iVar7;
  iVar7 = bcmp(__s1,pSVar8->pClassSizes,__nmemb << 2);
  if (iVar7 != 0) {
    __assert_fail("memcmp(pClassSizes, p->pClassSizes, sizeof(int)*Aig_ManObjNumMax(pAig)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswClass.c"
                  ,0x32d,"Ssw_Cla_t *Ssw_ClassesPrepareFromReprs(Aig_Man_t *)");
  }
  if (__s1 != (void *)0x0) {
    free(__s1);
  }
  return pSVar8;
}

Assistant:

Ssw_Cla_t * Ssw_ClassesPrepareFromReprs( Aig_Man_t * pAig )
{
    Ssw_Cla_t * p;
    Aig_Obj_t * pObj, * pRepr;
    int * pClassSizes, nEntries, i;
    // start the classes
    p = Ssw_ClassesStart( pAig );
    // allocate memory for classes
    p->pMemClasses = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(pAig) );
    // count classes
    p->nCands1 = 0;
    Aig_ManForEachObj( pAig, pObj, i )
    {
        if ( Ssw_ObjIsConst1Cand(pAig, pObj) )
        {
            p->nCands1++;
            continue;
        }
        if ( (pRepr = Aig_ObjRepr(pAig, pObj)) )
        {
            if ( p->pClassSizes[pRepr->Id]++ == 0 )
                p->pClassSizes[pRepr->Id]++;
        }
    }
    // add nodes
    nEntries = 0;
    p->nClasses = 0;
    pClassSizes = ABC_CALLOC( int, Aig_ManObjNumMax(pAig) );
    Aig_ManForEachObj( pAig, pObj, i )
    {
        if ( p->pClassSizes[i] )
        {
            p->pId2Class[i] = p->pMemClasses + nEntries;
            nEntries += p->pClassSizes[i];
            p->pId2Class[i][pClassSizes[i]++] = pObj;
            p->nClasses++;
            continue;
        }
        if ( Ssw_ObjIsConst1Cand(pAig, pObj) )
            continue;
        if ( (pRepr = Aig_ObjRepr(pAig, pObj)) )
            p->pId2Class[pRepr->Id][pClassSizes[pRepr->Id]++] = pObj;
    }
    p->pMemClassesFree = p->pMemClasses + nEntries;
    p->nLits = nEntries - p->nClasses;
    assert( memcmp(pClassSizes, p->pClassSizes, sizeof(int)*Aig_ManObjNumMax(pAig)) == 0 );
    ABC_FREE( pClassSizes );
//    Abc_Print( 1, "After converting:\n" );
//    Ssw_ClassesPrint( p, 0 );
    return p;
}